

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model_test.cc
# Opt level: O0

void anon_unknown.dwarf_4f15e6::noise_synth
               (ACMRandom *random,int lag,int n,int (*coords) [2],double *coeffs,double *data,int w,
               int h)

{
  double sigma;
  reference pvVar1;
  void *__dest;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  long in_R8;
  long in_R9;
  int in_stack_00000008;
  int in_stack_00000010;
  int dy;
  int dx;
  int i;
  double sum;
  vector<double,_std::allocator<double>_> padded;
  int y;
  int x;
  int padded_h;
  int padded_w;
  int pad_size;
  allocator_type *in_stack_ffffffffffffff60;
  vector<double,_std::allocator<double>_> *this;
  int local_7c;
  double local_78;
  undefined1 local_59 [29];
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  long local_28;
  long local_20;
  long local_18;
  int local_10;
  int local_c;
  
  local_2c = in_ESI * 3;
  local_30 = in_stack_00000008 + local_2c;
  local_34 = in_stack_00000010 + local_2c;
  local_38 = 0;
  local_3c = 0;
  sigma = (double)(long)(local_30 * local_34);
  this = (vector<double,_std::allocator<double>_> *)local_59;
  local_28 = in_R9;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  std::allocator<double>::allocator((allocator<double> *)0x5a6a2e);
  std::vector<double,_std::allocator<double>_>::vector
            (this,(size_type)sigma,in_stack_ffffffffffffff60);
  std::allocator<double>::~allocator((allocator<double> *)0x5a6a4e);
  for (local_3c = 0; local_3c < local_34; local_3c = local_3c + 1) {
    for (local_38 = 0; local_38 < local_30; local_38 = local_38 + 1) {
      in_stack_ffffffffffffff60 = (allocator_type *)randn((ACMRandom *)this,sigma);
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_59 + 1),
                          (long)(local_3c * local_30 + local_38));
      *pvVar1 = (value_type)in_stack_ffffffffffffff60;
    }
  }
  for (local_3c = local_c; local_3c < local_34; local_3c = local_3c + 1) {
    for (local_38 = local_c; local_38 < local_30; local_38 = local_38 + 1) {
      local_78 = 0.0;
      for (local_7c = 0; local_7c < local_10; local_7c = local_7c + 1) {
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_59 + 1),
                            (long)((local_3c + *(int *)(local_18 + 4 + (long)local_7c * 8)) *
                                   local_30 + local_38 + *(int *)(local_18 + (long)local_7c * 8)));
        local_78 = *pvVar1 * *(double *)(local_20 + (long)local_7c * 8) + local_78;
      }
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_59 + 1),
                          (long)(local_3c * local_30 + local_38));
      *pvVar1 = local_78 + *pvVar1;
    }
  }
  for (local_3c = 0; local_3c < in_stack_00000010; local_3c = local_3c + 1) {
    __dest = (void *)(local_28 + (long)(local_3c * in_stack_00000008) * 8);
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_59 + 1),0);
    memcpy(__dest,pvVar1 + local_3c * local_30,(long)in_stack_00000008 << 3);
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff60);
  return;
}

Assistant:

void noise_synth(libaom_test::ACMRandom *random, int lag, int n,
                 const int (*coords)[2], const double *coeffs, double *data,
                 int w, int h) {
  const int pad_size = 3 * lag;
  const int padded_w = w + pad_size;
  const int padded_h = h + pad_size;
  int x = 0, y = 0;
  std::vector<double> padded(padded_w * padded_h);

  for (y = 0; y < padded_h; ++y) {
    for (x = 0; x < padded_w; ++x) {
      padded[y * padded_w + x] = randn(random, 1.0);
    }
  }
  for (y = lag; y < padded_h; ++y) {
    for (x = lag; x < padded_w; ++x) {
      double sum = 0;
      int i = 0;
      for (i = 0; i < n; ++i) {
        const int dx = coords[i][0];
        const int dy = coords[i][1];
        sum += padded[(y + dy) * padded_w + (x + dx)] * coeffs[i];
      }
      padded[y * padded_w + x] += sum;
    }
  }
  // Copy over the padded rows to the output
  for (y = 0; y < h; ++y) {
    memcpy(data + y * w, &padded[0] + y * padded_w, sizeof(*data) * w);
  }
}